

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_resolv_gai.c
# Opt level: O0

int nni_get_port_by_name(char *name,uint32_t *portp)

{
  uint16_t uVar1;
  char *local_38;
  char *end;
  long port;
  servent *se;
  uint32_t *portp_local;
  char *name_local;
  
  local_38 = (char *)0x0;
  se = (servent *)portp;
  portp_local = (uint32_t *)name;
  end = (char *)strtol(name,&local_38,10);
  if (((*local_38 == '\0') && (-1 < (long)end)) && ((long)end < 0x10000)) {
    *(uint *)&se->s_name = (uint)end & 0xffff;
    name_local._4_4_ = 0;
  }
  else {
    port = (long)getservbyname((char *)portp_local,"tcp");
    if ((servent *)port == (servent *)0x0) {
      name_local._4_4_ = 0xf;
    }
    else {
      uVar1 = ntohs((uint16_t)((servent *)port)->s_port);
      *(uint *)&se->s_name = (uint)uVar1;
      name_local._4_4_ = 0;
    }
  }
  return name_local._4_4_;
}

Assistant:

int
nni_get_port_by_name(const char *name, uint32_t *portp)
{
	struct servent *se;
	long            port;
	char           *end = NULL;

	port = strtol(name, &end, 10);
	if ((*end == '\0') && (port >= 0) && (port <= 0xffff)) {
		*portp = (uint16_t) port;
		return (0);
	}

	if ((se = getservbyname(name, "tcp")) != NULL) {
		*portp = (uint16_t) ntohs(se->s_port);
		return (0);
	}
	return (NNG_EADDRINVAL);
}